

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

SigningResult __thiscall
wallet::CWallet::SignMessage(CWallet *this,string *message,PKHash *pkhash,string *str_sig)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  base_blob<160U> *pbVar3;
  char cVar4;
  SigningResult SVar5;
  _Base_ptr p_Var6;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock48;
  CScript script_pub_key;
  SignatureData sigdata;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  sigdata.complete = false;
  sigdata.witness = false;
  p_Var1 = &sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header;
  sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&sigdata.scriptSig,0,0xb8);
  sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sigdata.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sigdata.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  sigdata.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  sigdata.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sigdata.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sigdata.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sigdata.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  criticalblock48.super_unique_lock._M_device =
       *(mutex_type **)
        (pkhash->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems;
  pbVar3 = &(pkhash->super_BaseHash<uint160>).m_hash.super_base_blob<160U>;
  criticalblock48.super_unique_lock._M_owns = (bool)(pbVar3->m_data)._M_elems[8];
  criticalblock48.super_unique_lock._9_1_ = (pbVar3->m_data)._M_elems[9];
  criticalblock48.super_unique_lock._10_1_ = (pbVar3->m_data)._M_elems[10];
  criticalblock48.super_unique_lock._11_1_ = (pbVar3->m_data)._M_elems[0xb];
  criticalblock48.super_unique_lock._12_1_ = (pbVar3->m_data)._M_elems[0xc];
  criticalblock48.super_unique_lock._13_1_ = (pbVar3->m_data)._M_elems[0xd];
  criticalblock48.super_unique_lock._14_1_ = (pbVar3->m_data)._M_elems[0xe];
  criticalblock48.super_unique_lock._15_1_ = (pbVar3->m_data)._M_elems[0xf];
  sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  GetScriptForDestination(&script_pub_key,(CTxDestination *)&criticalblock48);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&criticalblock48);
  p_Var6 = (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  SVar5 = PRIVATE_KEY_NOT_AVAILABLE;
  do {
    if ((_Rb_tree_header *)p_Var6 == &(this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header) {
LAB_00460188:
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                (&script_pub_key.super_CScriptBase);
      SignatureData::~SignatureData(&sigdata);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return SVar5;
      }
      __stack_chk_fail();
    }
    cVar4 = (**(code **)(**(long **)(p_Var6 + 2) + 0xb0))
                      (*(long **)(p_Var6 + 2),&script_pub_key,&sigdata);
    if (cVar4 != '\0') {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock48,&this->cs_wallet,"cs_wallet",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                 ,0x8c8,false);
      SVar5 = (**(code **)(**(long **)(p_Var6 + 2) + 0xc0))
                        (*(long **)(p_Var6 + 2),message,pkhash,str_sig);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock48.super_unique_lock);
      goto LAB_00460188;
    }
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
  } while( true );
}

Assistant:

SigningResult CWallet::SignMessage(const std::string& message, const PKHash& pkhash, std::string& str_sig) const
{
    SignatureData sigdata;
    CScript script_pub_key = GetScriptForDestination(pkhash);
    for (const auto& spk_man_pair : m_spk_managers) {
        if (spk_man_pair.second->CanProvide(script_pub_key, sigdata)) {
            LOCK(cs_wallet);  // DescriptorScriptPubKeyMan calls IsLocked which can lock cs_wallet in a deadlocking order
            return spk_man_pair.second->SignMessage(message, pkhash, str_sig);
        }
    }
    return SigningResult::PRIVATE_KEY_NOT_AVAILABLE;
}